

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O1

void utf8_toUtf8(ENCODING *enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = *fromP;
  pcVar2 = *toP;
  if ((long)toLim - (long)pcVar2 < (long)fromLim - (long)pcVar1) {
    fromLim = pcVar1 + ((long)toLim - (long)pcVar2);
  }
  for (; pcVar1 != fromLim; pcVar1 = pcVar1 + 1) {
    *pcVar2 = *pcVar1;
    pcVar2 = pcVar2 + 1;
  }
  *fromP = pcVar1;
  *toP = pcVar2;
  return;
}

Assistant:

static
void utf8_toUtf8(const ENCODING *enc,
                 const char **fromP, const char *fromLim,
                 char **toP, const char *toLim)
{
  char *to;
  const char *from;
  cmExpatUnused(enc);
  if (fromLim - *fromP > toLim - *toP) {
    /* Avoid copying partial characters. */
    for (fromLim = *fromP + (toLim - *toP); fromLim > *fromP; fromLim--)
      if (((unsigned char)fromLim[-1] & 0xc0) != 0x80)
        break;
  }
  for (to = *toP, from = *fromP; from != fromLim; from++, to++)
    *to = *from;
  *fromP = from;
  *toP = to;
}